

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall
NominalTest_TestExistingSuperType_Test::TestBody(NominalTest_TestExistingSuperType_Test *this)

{
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar1;
  byte extraout_DL;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __ptr_00 [8];
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertHelper local_a0;
  Impl *local_98;
  Type A;
  optional<wasm::HeapType> superOfB;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_70;
  Type B;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  adStack_60 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_40;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_28;
  TypeBuilder builder_1;
  
  local_98 = (Impl *)0x0;
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_70,1);
  local_58._M_allocated_capacity = 0;
  B.id = 0;
  adStack_60 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 [8])0x0;
  wasm::TypeBuilder::setHeapType((ulong)&local_70,(Struct *)0x0);
  if (B.id != 0) {
    operator_delete((void *)B.id,local_58._M_allocated_capacity - B.id);
  }
  wasm::TypeBuilder::build();
  local_38._M_head_impl._0_1_ = local_58._M_local_buf[8] == 0U;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_local_buf[8] == 0U) {
    pvVar1 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)&B);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&A,pvVar1);
    wasm::Type::Type((Type *)&local_38,(HeapType)*A.id,Nullable);
    local_98 = local_38._M_head_impl;
    if (A.id != 0) {
      operator_delete((void *)A.id,
                      superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._8_8_ - A.id);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[(byte)local_58._M_local_buf[8]]._M_data)
              ((anon_class_1_0_00000001 *)&A,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&B);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_70);
    local_70._M_head_impl = (Impl *)0x0;
    wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,1);
    local_58._M_allocated_capacity = 0;
    B.id = 0;
    adStack_60 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   [8])0x0;
    wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
    if (B.id != 0) {
      operator_delete((void *)B.id,local_58._M_allocated_capacity - B.id);
    }
    wasm::Type::getHeapType();
    wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x0);
    wasm::TypeBuilder::build();
    local_38._M_head_impl._0_1_ = local_58._M_local_buf[8] == 0U;
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58._M_local_buf[8] == 0U) {
      pvVar1 = std::
               get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                         ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           *)&B);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&A,pvVar1);
      wasm::Type::Type((Type *)&local_38,(HeapType)*A.id,Nullable);
      local_70._M_head_impl = local_38._M_head_impl;
      if (A.id != 0) {
        operator_delete((void *)A.id,
                        superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._8_8_ - A.id);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
        ::_S_vtable._M_arr[(byte)local_58._M_local_buf[8]]._M_data)
                ((anon_class_1_0_00000001 *)&A,
                 (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  *)&B);
      wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
      B.id = wasm::Type::getHeapType();
      A.id = wasm::HeapType::getSuperType();
      local_38._M_head_impl._0_1_ = extraout_DL;
      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
      if ((extraout_DL & 1) == 0) {
        testing::Message::Message((Message *)&local_28);
        this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&B,(internal *)&local_38,(AssertionResult *)0x1ae83b,"false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x3a8,(char *)B.id);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)B.id != &local_58) {
          operator_delete((void *)B.id,local_58._M_allocated_capacity + 1);
        }
        if (local_28._M_head_impl != (Impl *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
        __ptr_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     [8])local_30;
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
      }
      else {
        local_38._M_head_impl = (Impl *)wasm::Type::getHeapType();
        testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                  ((internal *)&B,"*superOfB","A.getHeapType()",(HeapType *)&A,(HeapType *)&local_38
                  );
        if ((char)B.id == '\0') {
          testing::Message::Message((Message *)&local_38);
          if (adStack_60 ==
              (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                [8])0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)adStack_60;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_28,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x3a9,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_38)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
          if (local_38._M_head_impl != (Impl *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        if (adStack_60 !=
            (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(adStack_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       adStack_60);
        }
        local_38._M_head_impl = (Impl *)wasm::Type::getHeapType();
        local_28._M_head_impl = (Impl *)wasm::Type::getHeapType();
        testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
                  ((internal *)&B,"B.getHeapType()","A.getHeapType()",(HeapType *)&local_38,
                   (HeapType *)&local_28);
        if ((char)B.id == '\0') {
          testing::Message::Message((Message *)&local_38);
          if (adStack_60 ==
              (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                [8])0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)adStack_60;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_28,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x3aa,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_38)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
          if (local_38._M_head_impl != (Impl *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        if (adStack_60 ==
            (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              [8])0x0) {
          return;
        }
        this_01 = adStack_60;
        __ptr_00 = adStack_60;
      }
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __ptr_00);
      return;
    }
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A,(internal *)&local_38,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x3a1,(char *)A.id);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((bool *)A.id !=
        &superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged) {
      operator_delete((void *)A.id,
                      superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._8_8_ + 1);
    }
    if (local_40.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_40.data_ + 8))();
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[(byte)local_58._M_local_buf[8]]._M_data)
              ((anon_class_1_0_00000001 *)&A,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&B);
    this_00 = &local_28;
  }
  else {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A,(internal *)&local_38,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x395,(char *)A.id);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((bool *)A.id !=
        &superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged) {
      operator_delete((void *)A.id,
                      superOfB.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._8_8_ + 1);
    }
    if (local_28._M_head_impl != (Impl *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[(byte)local_58._M_local_buf[8]]._M_data)
              ((anon_class_1_0_00000001 *)&A,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&B);
    this_00 = &local_70;
  }
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)this_00);
  return;
}

Assistant:

TEST_F(NominalTest, TestExistingSuperType) {
  // Build an initial type A
  Type A;
  {
    TypeBuilder builder(1);
    builder[0] = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = Type(built[0], Nullable);
  }

  // Build a type B <: A using a new builder
  Type B;
  {
    TypeBuilder builder(1);
    builder[0] = Struct();
    builder.setSubType(0, A.getHeapType());
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    B = Type(built[0], Nullable);
  }

  // Test that B <: A where A is the initial type A
  auto superOfB = B.getHeapType().getSuperType();
  ASSERT_TRUE(superOfB);
  EXPECT_EQ(*superOfB, A.getHeapType());
  EXPECT_NE(B.getHeapType(), A.getHeapType());
}